

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O0

bool __thiscall
soul::SourceCodeOperations::reload
          (SourceCodeOperations *this,CompileMessageList *messageList,CodeLocation *code,
          ApplyModificationFn *applyMod)

{
  CodeLocation *messageList_00;
  bool bVar1;
  CodeLocation local_38;
  ApplyModificationFn *local_28;
  ApplyModificationFn *applyMod_local;
  CodeLocation *code_local;
  CompileMessageList *messageList_local;
  SourceCodeOperations *this_local;
  
  local_28 = applyMod;
  applyMod_local = (ApplyModificationFn *)code;
  code_local = (CodeLocation *)messageList;
  messageList_local = (CompileMessageList *)this;
  std::function<void_(const_soul::SourceCodeOperations::TextModificationOp_&)>::operator=
            (&this->applyModification,applyMod);
  messageList_00 = code_local;
  CodeLocation::CodeLocation(&local_38,code);
  bVar1 = reparse(this,(CompileMessageList *)messageList_00,&local_38);
  CodeLocation::~CodeLocation(&local_38);
  return bVar1;
}

Assistant:

bool SourceCodeOperations::reload (CompileMessageList& messageList, CodeLocation code, ApplyModificationFn applyMod)
{
    applyModification = std::move (applyMod);
    return reparse (messageList, std::move (code));
}